

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherCWrapper.cpp
# Opt level: O2

efsw_watchid
efsw_addwatch_withoptions
          (efsw_watcher watcher,char *directory,efsw_pfn_fileaction_callback callback_fn,
          int recursive,efsw_watcher_option *options,int options_number,void *param)

{
  WatchID WVar1;
  ulong uVar2;
  ulong uVar3;
  allocator local_7d;
  int local_7c;
  Watcher_CAPI *callback;
  char *local_70;
  string local_68;
  _Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> local_48;
  
  local_7c = recursive;
  local_70 = directory;
  callback = find_callback(watcher,callback_fn,param);
  if (callback == (Watcher_CAPI *)0x0) {
    callback = (Watcher_CAPI *)operator_new(0x20);
    (callback->super_FileWatchListener)._vptr_FileWatchListener =
         (_func_int **)&PTR__FileWatchListener_001349e8;
    callback->mWatcher = watcher;
    callback->mFn = callback_fn;
    callback->mParam = param;
    std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>::push_back(&g_callbacks,&callback);
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)options_number;
  if (options_number < 1) {
    uVar3 = uVar2;
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    local_68._M_dataplus._M_p = *(pointer *)(options + uVar2);
    std::vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>::
    emplace_back<efsw::WatcherOption>
              ((vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *)&local_48,
               (WatcherOption *)&local_68);
  }
  std::__cxx11::string::string((string *)&local_68,local_70,&local_7d);
  WVar1 = efsw::FileWatcher::addWatch
                    ((FileWatcher *)watcher,&local_68,&callback->super_FileWatchListener,
                     local_7c != 0,
                     (vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *)&local_48)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::_Vector_base<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_>::~_Vector_base
            (&local_48);
  return WVar1;
}

Assistant:

efsw_watchid  efsw_addwatch_withoptions(efsw_watcher watcher, const char* directory,
										efsw_pfn_fileaction_callback callback_fn, int recursive,
										efsw_watcher_option *options, int options_number,
										void* param) {
	Watcher_CAPI* callback = find_callback( watcher, callback_fn, param );

	if ( callback == NULL ) {
		callback = new Watcher_CAPI( watcher, callback_fn, param );
		g_callbacks.push_back( callback );
	}

	std::vector<efsw::WatcherOption> watcher_options{};
	for ( int i = 0; i < options_number; i++ ) {
		efsw_watcher_option* option = &options[i];
		watcher_options.emplace_back( efsw::WatcherOption{
			static_cast<efsw::Option>(option->option), option->value } );
	}

	return ( (efsw::FileWatcher*)watcher )
		->addWatch( std::string( directory ), callback, TOBOOL( recursive ), watcher_options );
}